

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_dss_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *buf;
  ulong q_len;
  uchar *buf_00;
  ulong p_len;
  ulong g_len;
  DSA *dsactx;
  
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *abstract = (void *)0x0;
  }
  uVar1 = _libssh2_ntohu32(hostkey_data);
  iVar3 = -1;
  if (uVar1 == 7) {
    iVar2 = strncmp((char *)(hostkey_data + 4),"ssh-dss",7);
    if (iVar2 == 0) {
      uVar1 = _libssh2_ntohu32(hostkey_data + 0xb);
      p_len = (ulong)uVar1;
      buf = hostkey_data + p_len + 0xf;
      uVar1 = _libssh2_ntohu32(buf);
      q_len = (ulong)uVar1;
      buf_00 = buf + q_len + 4;
      uVar1 = _libssh2_ntohu32(buf_00);
      g_len = (ulong)uVar1;
      uVar1 = _libssh2_ntohu32(buf_00 + g_len + 4);
      iVar2 = _libssh2_dsa_new(&dsactx,hostkey_data + 0xf,p_len,hostkey_data + p_len + 0x13,q_len,
                               buf + q_len + 8,g_len,buf_00 + g_len + 8,(ulong)uVar1,(uchar *)0x0,0)
      ;
      if (iVar2 == 0) {
        *abstract = dsactx;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
hostkey_method_ssh_dss_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    const unsigned char *p, *q, *g, *y, *s;
    unsigned long p_len, q_len, g_len, y_len, len;
    int ret;

    (void) hostkey_data_len;

    if (*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    s = hostkey_data;
    len = _libssh2_ntohu32(s);
    s += 4;
    if (len != 7 || strncmp((char *) s, "ssh-dss", 7) != 0) {
        return -1;
    }
    s += 7;

    p_len = _libssh2_ntohu32(s);
    s += 4;
    p = s;
    s += p_len;
    q_len = _libssh2_ntohu32(s);
    s += 4;
    q = s;
    s += q_len;
    g_len = _libssh2_ntohu32(s);
    s += 4;
    g = s;
    s += g_len;
    y_len = _libssh2_ntohu32(s);
    s += 4;
    y = s;
    /* s += y_len; */

    ret = _libssh2_dsa_new(&dsactx, p, p_len, q, q_len,
                           g, g_len, y, y_len, NULL, 0);
    if (ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}